

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMethodList *stm)

{
  CMethod *pCVar1;
  pointer puVar2;
  char *pcVar3;
  ulong uVar4;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  char local_38 [8];
  char local_30 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: methodlist\n",0x18);
  puVar2 = (stm->methods).
           super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((stm->methods).
      super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    uVar4 = 0;
    do {
      pCVar1 = puVar2[uVar4]._M_t.super___uniq_ptr_impl<CMethod,_std::default_delete<CMethod>_>._M_t
               .super__Tuple_impl<0UL,_CMethod_*,_std::default_delete<CMethod>_>.
               super__Head_base<0UL,_CMethod_*,_false>._M_head_impl;
      if (pCVar1 == (CMethod *)0x0) {
        CError::CError((CError *)local_48,&CError::AST_ERROR_abi_cxx11_,
                       &(stm->super_IWrapper).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                  (&this->errors,(CError *)local_48);
        pcVar3 = local_38;
        local_40._M_p = (pointer)local_48;
        goto LAB_00121e8a;
      }
      (*(code *)**(undefined8 **)&(pCVar1->super_IWrapper).super_PositionedNode)(pCVar1,this);
      uVar4 = uVar4 + 1;
      puVar2 = (stm->methods).
               super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(stm->methods).
                                   super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
  }
  TypeInfo::TypeInfo((TypeInfo *)local_48,VOID);
  (this->lastCalculatedType).isPrimitive = (bool)local_48[0];
  *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_48._1_3_;
  (this->lastCalculatedType).type = local_48._4_4_;
  std::__cxx11::string::operator=
            ((string *)&(this->lastCalculatedType).className,(string *)&local_40);
  pcVar3 = local_30;
LAB_00121e8a:
  if (local_40._M_p != pcVar3) {
    operator_delete(local_40._M_p);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CMethodList &stm ) 
{
	std::cout << "typechecker: methodlist\n";
    bool areAllMethods = true;
    for (int index = 0; index < stm.methods.size(); ++index) {
        auto method = stm.methods[index].get();
        if( !method ) {
            areAllMethods = false;
            break;
        }
        method->Accept( *this );
    }
    if( areAllMethods ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}